

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrShareSpacesInfoMETA *value)

{
  NextChainResult NVar1;
  ValidateXrHandleResult VVar2;
  XrResult XVar3;
  ulong uVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrShareSpacesRecipientGroupsMETA *value_00;
  long lVar5;
  XrSpace_T *in_stack_fffffffffffffcd8;
  allocator local_319;
  string *local_318;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_288;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_318 = command_name;
  if (value->type != XR_TYPE_SHARE_SPACES_INFO_META) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrShareSpacesInfoMETA",value->type,
               "VUID-XrShareSpacesInfoMETA-type-type",XR_TYPE_SHARE_SPACES_INFO_META,
               "XR_TYPE_SHARE_SPACES_INFO_META");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar1 = ValidateNextChain(instance_info,local_318,objects_info,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_310);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_310,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string
                ((string *)&local_310,"VUID-XrShareSpacesInfoMETA-next-unique",&local_319);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2e8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrShareSpacesInfoMETA struct"
                 ,&local_2e9);
      CoreValidLogMessage(instance_info,&local_310,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f8,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1f8);
      std::__cxx11::string::~string((string *)&local_310);
LAB_0019de35:
      std::__cxx11::string::~string((string *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrShareSpacesInfoMETA-next-next",
                 (allocator *)&local_2e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,objects_info);
      std::__cxx11::string::string
                ((string *)&local_310,
                 "Invalid structure(s) in \"next\" chain for XrShareSpacesInfoMETA struct \"next\"",
                 &local_319);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      goto LAB_0019de35;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  if ((value->spaceCount == 0) && (value->spaces != (XrSpace *)0x0)) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrShareSpacesInfoMETA-spaceCount-arraylength",
               (allocator *)&local_2e8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,objects_info);
    std::__cxx11::string::string
              ((string *)&local_310,
               "Structure XrShareSpacesInfoMETA member spaceCount is non-optional and must be greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&error_message);
  }
  if (value->spaces == (XrSpace *)0x0) {
    if (value->spaceCount == 0) goto LAB_0019e0b6;
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrShareSpacesInfoMETA-spaces-parameter",
               (allocator *)&local_2e8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_228,objects_info);
    std::__cxx11::string::string
              ((string *)&local_310,
               "XrShareSpacesInfoMETA contains invalid NULL for XrSpace \"spaces\" is which not optional since \"spaceCount\" is set and must be non-NULL"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_228,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    this = &local_228;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    while (uVar4 < value->spaceCount) {
      VVar2 = VerifyXrSpaceHandle((XrSpace *)((long)value->spaces + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
      if (VVar2 != VALIDATE_XR_HANDLE_SUCCESS) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Invalid XrSpace handle \"spaces\" ");
        HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffcd8);
        std::operator<<((ostream *)&error_message,(string *)&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::string
                  ((string *)&local_310,"VUID-XrShareSpacesInfoMETA-spaces-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_240,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_310,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_240,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_240);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        return XR_ERROR_HANDLE_INVALID;
      }
    }
LAB_0019e0b6:
    value_00 = (XrShareSpacesRecipientGroupsMETA *)value->recipientInfo;
    if (value_00 == (XrShareSpacesRecipientGroupsMETA *)0x0) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                 (allocator *)&local_2e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_258,objects_info);
      std::__cxx11::string::string
                ((string *)&local_310,
                 "XrShareSpacesInfoMETA contains invalid NULL for XrShareSpacesRecipientBaseHeaderMETA \"recipientInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_258,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      this = &local_258;
    }
    else {
      if (value_00->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
        XVar3 = ValidateXrStruct(instance_info,local_318,objects_info,true,true,value_00);
        if (XVar3 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrShareSpacesInfoMETA member recipientInfo"
                     ,(allocator *)&local_310);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_310,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                     (allocator *)&local_2e8);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_270,objects_info);
          CoreValidLogMessage(instance_info,&local_310,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_270,&error_message);
          std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~_Vector_base(&local_270);
          std::__cxx11::string::~string((string *)&local_310);
          goto LAB_0019e29f;
        }
        value_00 = (XrShareSpacesRecipientGroupsMETA *)value->recipientInfo;
      }
      XVar3 = ValidateXrStruct(instance_info,local_318,objects_info,true,false,
                               (XrShareSpacesRecipientBaseHeaderMETA *)value_00);
      if (XVar3 == XR_SUCCESS) {
        return XR_SUCCESS;
      }
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                 (allocator *)&local_2e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_288,objects_info);
      std::__cxx11::string::string
                ((string *)&local_310,
                 "Structure XrShareSpacesInfoMETA member recipientInfo is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_318,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_288,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      this = &local_288;
    }
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
LAB_0019e29f:
  std::__cxx11::string::~string((string *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrShareSpacesInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SHARE_SPACES_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrShareSpacesInfoMETA",
                             value->type, "VUID-XrShareSpacesInfoMETA-type-type", XR_TYPE_SHARE_SPACES_INFO_META, "XR_TYPE_SHARE_SPACES_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrShareSpacesInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrShareSpacesInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrShareSpacesInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->spaceCount && nullptr != value->spaces) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrShareSpacesInfoMETA member spaceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->spaces && 0 != value->spaceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaces-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrShareSpacesInfoMETA contains invalid NULL for XrSpace \"spaces\" is which not "
                            "optional since \"spaceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->spaces) {
        for (uint32_t value_spaces_inc = 0; value_spaces_inc < value->spaceCount; ++value_spaces_inc) {
            {
                // writeValidateInlineHandleValidation
                ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->spaces[value_spaces_inc]);
                if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                    // Not a valid handle or NULL (which is not valid in this case)
                    std::ostringstream oss;
                    oss << "Invalid XrSpace handle \"spaces\" ";
                    oss << HandleToHexString(value->spaces[value_spaces_inc]);
                    CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaces-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info, oss.str());
                    return XR_ERROR_HANDLE_INVALID;
                }
            }
        }
    }
    // Non-optional pointer/array variable that needs to not be NULL
    if (nullptr == value->recipientInfo) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrShareSpacesInfoMETA contains invalid NULL for XrShareSpacesRecipientBaseHeaderMETA \"recipientInfo\" which is not "
                            "optional and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate if XrShareSpacesRecipientBaseHeaderMETA is a child structure of type XrShareSpacesRecipientGroupsMETA and it is valid
    {
        const XrShareSpacesRecipientGroupsMETA* new_sharespacesrecipientgroupsmeta_value = reinterpret_cast<const XrShareSpacesRecipientGroupsMETA*>(value->recipientInfo);
        if (new_sharespacesrecipientgroupsmeta_value->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_sharespacesrecipientgroupsmeta_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrShareSpacesInfoMETA member recipientInfo";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate that the base-structure XrShareSpacesRecipientBaseHeaderMETA is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, value->recipientInfo);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrShareSpacesInfoMETA member recipientInfo is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}